

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O3

string * __thiscall
CMessageHeader::GetCommand_abi_cxx11_(string *__return_storage_ptr__,CMessageHeader *this)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = strnlen(this->pchCommand,0xc);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this->pchCommand,this->pchCommand + sVar2);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CMessageHeader::GetCommand() const
{
    return std::string(pchCommand, pchCommand + strnlen(pchCommand, COMMAND_SIZE));
}